

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileVariable(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxu32 nLine_00;
  SyToken *pSVar1;
  sxi32 sVar2;
  SyHashEntry *pSVar3;
  sxi32 rc;
  void *p3;
  char *pcStack_38;
  sxi32 iP1;
  char *zName;
  SyString *pName;
  SyHashEntry *pEntry;
  sxu32 nLine;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  nLine_00 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0xc) != 0)) {
    pSVar1 = pGen->pIn;
    pGen->pIn = pGen->pIn + 1;
    pSVar3 = SyHashGet(&pGen->hVar,(pSVar1->sData).zString,(pSVar1->sData).nByte);
    if (pSVar3 == (SyHashEntry *)0x0) {
      pcStack_38 = SyMemBackendStrDup(&pGen->pVm->sAllocator,(pSVar1->sData).zString,
                                      (pSVar1->sData).nByte);
      if (pcStack_38 == (char *)0x0) {
        sVar2 = GenStateOutOfMem(pGen);
        return sVar2;
      }
      SyHashInsert(&pGen->hVar,pcStack_38,(pSVar1->sData).nByte,pcStack_38);
    }
    else {
      pcStack_38 = (char *)pSVar3->pUserData;
    }
    p3._4_4_ = 0;
    if ((iCompileFlag & 2U) != 0) {
      p3._4_4_ = (uint)((iCompileFlag & 1U) == 0);
    }
    jx9VmEmitInstr(pGen->pVm,3,p3._4_4_,0,pcStack_38,(sxu32 *)0x0);
    pGen_local._4_4_ = 0;
  }
  else {
    sVar2 = jx9GenCompileError(pGen,1,nLine_00,"Invalid variable name");
    if (sVar2 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileVariable(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	sxu32 nLine = pGen->pIn->nLine;
	SyHashEntry *pEntry;
	SyString *pName;
	char *zName = 0;
	sxi32 iP1;
	void *p3;
	sxi32 rc;
	
	pGen->pIn++; /* Jump the dollar sign '$' */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid variable name */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Invalid variable name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Extract variable name */
	pName = &pGen->pIn->sData;
	/* Advance the stream cursor */
	pGen->pIn++;
	pEntry = SyHashGet(&pGen->hVar, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Duplicate name */
		zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
		if( zName == 0 ){
			return GenStateOutOfMem(pGen);
		}
		/* Install in the hashtable */
		SyHashInsert(&pGen->hVar, zName, pName->nByte, zName);
	}else{
		/* Name already available */
		zName = (char *)pEntry->pUserData;
	}
	p3 = (void *)zName;	
	iP1 = 0;
	if( iCompileFlag & EXPR_FLAG_RDONLY_LOAD ){
		if( (iCompileFlag & EXPR_FLAG_LOAD_IDX_STORE) == 0 ){
			/* Read-only load.In other words do not create the variable if inexistant */
			iP1 = 1;
		}
	}
	/* Emit the load instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD, iP1, 0, p3, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}